

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O3

void __thiscall ConstantsTest_Values_Test<float>::TestBody(ConstantsTest_Values_Test<float> *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  AssertionResult local_18;
  
  local_28.ss_.ptr_._0_4_ = 0x40490fdb;
  local_20.data_._0_4_ = 0x40490fdb;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::pi)",
             "Constants<TypeParam>::pi()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x13,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (((CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0x50df5ce0;
  local_20.data_._0_4_ = 0x50df5ce0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::c)",
             "Constants<TypeParam>::c()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (((CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0x50df5ce0;
  local_20.data_._0_4_ = 0x50df5ce0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::lightVelocity)",
             "Constants<TypeParam>::lightVelocity()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (((CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0xb004078c;
  local_20.data_._0_4_ = 0xb004078c;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::electronCharge)",
             "Constants<TypeParam>::electronCharge()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (((CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0x1290580b;
  local_20.data_._0_4_ = 0x1290580b;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::electronMass)",
             "Constants<TypeParam>::electronMass()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (((CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0x180169b6;
  local_20.data_._0_4_ = 0x180169b6;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::protonMass)",
             "Constants<TypeParam>::protonMass()",(float *)&local_28,(float *)&local_20);
  bVar1 = local_18.success_;
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_28.ss_.ptr_._0_4_ = 0x12a71a82;
  local_20.data_._0_4_ = 0x12a71a82;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_18,"static_cast<TypeParam>(constants::planck)",
             "Constants<TypeParam>::planck()",(float *)&local_28,(float *)&local_20);
  if (local_18.success_ == false) {
    testing::Message::Message(&local_28);
    if (local_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
  }
  else {
    testing::AssertionResult::~AssertionResult(&local_18);
    local_28.ss_.ptr_._0_4_ = 0x2be17c7f;
    local_20.data_._0_4_ = 0x2be17c7f;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_18,"static_cast<TypeParam>(constants::eV)",
               "Constants<TypeParam>::eV()",(float *)&local_28,(float *)&local_20);
    if (local_18.success_ == false) {
      testing::Message::Message(&local_28);
      if (local_18.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x1a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_20,&local_28);
    }
    else {
      testing::AssertionResult::~AssertionResult(&local_18);
      local_28.ss_.ptr_._0_4_ = 0x35d70a5e;
      local_20.data_._0_4_ = 0x35d70a5e;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&local_18,"static_cast<TypeParam>(constants::meV)",
                 "Constants<TypeParam>::meV()",(float *)&local_28,(float *)&local_20);
      if (local_18.success_ != false) goto LAB_00177eaa;
      testing::Message::Message(&local_28);
      if (local_18.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_18.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x1b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_20,&local_28);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  testing::Message::~Message(&local_28);
LAB_00177eaa:
  testing::AssertionResult::~AssertionResult(&local_18);
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}